

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.h
# Opt level: O1

double __thiscall
BayesianGameForDecPOMDPStage::GetImmediateReward
          (BayesianGameForDecPOMDPStage *this,Index jtI,Index jaI,
          FactoredDecPOMDPDiscreteInterface *fd)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (this->_m_areCachedImmediateRewards != true) {
    dVar6 = ComputeImmediateReward(this,jtI,jaI);
    return dVar6;
  }
  uVar3 = (ulong)jtI;
  pvVar1 = (this->_m_immR).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->_m_immR).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar5 = uVar3;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    uVar5 = (ulong)jaI;
    lVar2 = *(long *)&pvVar1[uVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    uVar4 = (long)*(pointer *)
                   ((long)&pvVar1[uVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar2 >> 3;
    if (uVar5 < uVar4) {
      return *(double *)(lVar2 + uVar5 * 8);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar4
            );
}

Assistant:

double GetImmediateReward(Index jtI, Index jaI,
                                  const FactoredDecPOMDPDiscreteInterface* fd=0) const
        {
            if(_m_areCachedImmediateRewards)
                return _m_immR.at(jtI).at(jaI);
            else
                return ComputeImmediateReward(jtI, jaI);
        }